

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int upb_JsonDecoder_Decode(jsondec *d,upb_Message *msg,upb_MessageDef *m)

{
  int iVar1;
  
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x5ff,
                  "int upb_JsonDecoder_Decode(jsondec *const, upb_Message *const, const upb_MessageDef *const)"
                 );
  }
  iVar1 = __sigsetjmp(d->err,0);
  if (iVar1 == 0) {
    jsondec_tomsg(d,msg,m);
    jsondec_consumews(d);
    if (d->ptr == d->end) {
      return d->result;
    }
    upb_Status_SetErrorFormat
              (d->status,"Error parsing JSON @%d:%d: %s",(ulong)(uint)d->line,
               (ulong)(uint)((int)d->ptr - *(int *)&d->line_begin),"unexpected trailing characters")
    ;
  }
  return 2;
}

Assistant:

static int upb_JsonDecoder_Decode(jsondec* const d, upb_Message* const msg,
                                  const upb_MessageDef* const m) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  if (UPB_SETJMP(d->err)) return kUpb_JsonDecodeResult_Error;

  jsondec_tomsg(d, msg, m);

  // Consume any trailing whitespace before checking if we read the entire
  // input.
  jsondec_consumews(d);

  if (d->ptr == d->end) {
    return d->result;
  } else {
    jsondec_seterrmsg(d, "unexpected trailing characters");
    return kUpb_JsonDecodeResult_Error;
  }
}